

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O1

void __thiscall cmTestGenerator::GenerateOldStyle(cmTestGenerator *this,ostream *fout,Indent indent)

{
  char cVar1;
  cmTest *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  ostream *poVar5;
  _Rb_tree_header *p_Var6;
  char *__s;
  _Base_ptr p_Var7;
  int iVar8;
  size_type sVar9;
  pointer pbVar10;
  string exe;
  string *arg;
  string local_b0;
  int local_90;
  allocator<char> local_89;
  cmTestGenerator *local_88;
  string local_80;
  pointer local_60;
  pointer local_58;
  string local_50;
  
  this->TestGenerated = true;
  pcVar2 = this->Test;
  pbVar10 = (pcVar2->Command).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  pcVar3 = (pbVar10->_M_dataplus)._M_p;
  local_90 = indent.Level;
  local_88 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar3,pcVar3 + pbVar10->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_80);
  iVar8 = local_90;
  if (0 < local_90) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,"add_test(",9);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar3 = (local_88->Test->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar3,pcVar3 + (local_88->Test->Name)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (fout,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," \"",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_60 = (pcVar2->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pbVar10 = (pcVar2->Command).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar10 + 1 != local_60) {
    local_58 = pbVar10 + 1;
    std::__ostream_insert<char,std::char_traits<char>>(fout," \"",2);
    sVar4 = pbVar10[1]._M_string_length;
    if (sVar4 != 0) {
      pcVar3 = pbVar10[1]._M_dataplus._M_p;
      sVar9 = 0;
      do {
        cVar1 = pcVar3[sVar9];
        if (cVar1 == '\"') {
          local_b0._M_dataplus._M_p._0_1_ = 0x5c;
          std::__ostream_insert<char,std::char_traits<char>>(fout,(char *)&local_b0,1);
        }
        local_b0._M_dataplus._M_p._0_1_ = cVar1;
        std::__ostream_insert<char,std::char_traits<char>>(fout,(char *)&local_b0,1);
        sVar9 = sVar9 + 1;
      } while (sVar4 != sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(fout,"\"",1);
    pbVar10 = local_58;
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,")",1);
  cVar1 = (char)fout;
  std::ios::widen((char)fout->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  pcVar2 = local_88->Test;
  iVar8 = local_90;
  if (0 < local_90) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,"set_tests_properties(",0x15);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar3 = (local_88->Test->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar3,pcVar3 + (local_88->Test->Name)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (fout,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," PROPERTIES ",0xc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  p_Var7 = (pcVar2->Properties).
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(pcVar2->Properties).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var6) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(fout," ",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (fout,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      __s = cmProperty::GetValue((cmProperty *)(p_Var7 + 2));
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_89);
      cmOutputConverter::EscapeForCMake(&local_b0,&local_50);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var6);
  }
  GenerateInternalProperties(local_88,fout);
  std::__ostream_insert<char,std::char_traits<char>>(fout,")",1);
  std::ios::widen((char)fout->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTestGenerator::GenerateOldStyle(std::ostream& fout, Indent indent)
{
  this->TestGenerated = true;

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  std::string exe = command[0];
  cmSystemTools::ConvertToUnixSlashes(exe);
  fout << indent;
  fout << "add_test(";
  fout << this->Test->GetName() << " \"" << exe << "\"";

  for (std::string const& arg : cmMakeRange(command).advance(1)) {
    // Just double-quote all arguments so they are re-parsed
    // correctly by the test system.
    fout << " \"";
    for (char c : arg) {
      // Escape quotes within arguments.  We should escape
      // backslashes too but we cannot because it makes the result
      // inconsistent with previous behavior of this command.
      if (c == '"') {
        fout << '\\';
      }
      fout << c;
    }
    fout << "\"";
  }
  fout << ")" << std::endl;

  // Output properties for the test.
  cmPropertyMap& pm = this->Test->GetProperties();
  fout << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
  for (auto const& i : pm) {
    fout << " " << i.first << " "
         << cmOutputConverter::EscapeForCMake(i.second.GetValue());
  }
  this->GenerateInternalProperties(fout);
  fout << ")" << std::endl;
}